

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

int libtorrent::search(span<const_char> src,span<const_char> target)

{
  char *pcVar1;
  char *pcVar2;
  char *__first2;
  char *__last2;
  char *it;
  span<const_char> target_local;
  span<const_char> src_local;
  
  target_local.m_len = (difference_type)src.m_ptr;
  target_local.m_ptr = (char *)target.m_len;
  it = target.m_ptr;
  pcVar1 = span<const_char>::begin((span<const_char> *)&it);
  pcVar2 = span<const_char>::end((span<const_char> *)&it);
  __first2 = span<const_char>::begin((span<const_char> *)&target_local.m_len);
  __last2 = span<const_char>::end((span<const_char> *)&target_local.m_len);
  pcVar1 = std::search<char_const*,char_const*>(pcVar1,pcVar2,__first2,__last2);
  pcVar2 = span<const_char>::end((span<const_char> *)&it);
  if (pcVar1 == pcVar2) {
    src_local.m_len._4_4_ = -1;
  }
  else {
    pcVar2 = span<const_char>::begin((span<const_char> *)&it);
    src_local.m_len._4_4_ = (int)pcVar1 - (int)pcVar2;
  }
  return src_local.m_len._4_4_;
}

Assistant:

int search(span<char const> src, span<char const> target)
	{
		TORRENT_ASSERT(!src.empty());
		TORRENT_ASSERT(!target.empty());
		TORRENT_ASSERT(target.size() >= src.size());
		TORRENT_ASSERT(target.size() < std::numeric_limits<int>::max());

		auto const it = std::search(target.begin(), target.end(), src.begin(), src.end());

		// no complete sync
		if (it == target.end()) return -1;
		return static_cast<int>(it - target.begin());
	}